

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O1

int quote_fname(char *file)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  byte *pbVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  byte *pbVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  byte *pbVar13;
  char ver_buf [16];
  char ver [16];
  char namebuf [256];
  char fbuf [256];
  char local_258 [16];
  char local_248 [16];
  char local_238 [256];
  byte local_138 [264];
  
  pcVar10 = local_258;
  pbVar5 = local_138;
  pbVar9 = (byte *)file;
  do {
    bVar1 = *pbVar9;
    lVar12 = 1;
    pbVar13 = pbVar5;
    if (bVar1 < 0x3b) {
      if (bVar1 == 0x27) goto LAB_001370d2;
      if (bVar1 == 0) goto code_r0x001370f0;
    }
    else if ((bVar1 == 0x3e) || (bVar1 == 0x3b)) {
LAB_001370d2:
      *pbVar5 = 0x27;
      lVar12 = 2;
      pbVar13 = pbVar5 + 1;
    }
    pbVar5 = pbVar5 + lVar12;
    *pbVar13 = bVar1;
    pbVar9 = pbVar9 + 1;
  } while( true );
joined_r0x0013725f:
  if (local_258[0] == '\0') goto LAB_00137275;
  pcVar10 = pcVar10 + 1;
  if ((byte)(local_258[0] - 0x3aU) < 0xf6) goto LAB_001372b2;
  local_258[0] = *pcVar10;
  goto joined_r0x0013725f;
LAB_00137275:
  pcVar7[-1] = ';';
  pcVar7[0] = '\0';
  *pcVar11 = '\0';
  uVar8 = strtoul(pcVar7 + 1,(char **)0x0,10);
  sprintf(local_258,"%u",uVar8 & 0xffffffff);
  strcat(local_238,local_258);
  goto LAB_001372b2;
code_r0x001370f0:
  *pbVar5 = 0;
  pbVar5 = local_138;
  separate_version((char *)pbVar5,local_248,1);
  if (local_138[0] == 0) {
    bVar3 = true;
  }
  else {
    bVar2 = false;
    pbVar5 = local_138;
    do {
      pbVar9 = pbVar5 + 1;
      if (local_138[0] == 0x27) {
        if (pbVar5[1] != 0) {
          pbVar9 = pbVar5 + 2;
        }
      }
      else if ((local_138[0] == 0x2e) && (*pbVar9 != 0)) {
        bVar2 = true;
      }
      pbVar5 = pbVar9;
      local_138[0] = *pbVar5;
      bVar3 = !bVar2;
    } while ((local_138[0] != 0) && (!bVar2));
  }
  if (bVar3) {
    if (pbVar5[-1] == 0x2e) {
      pbVar5[-1] = 0x27;
      pbVar5[0] = 0x2e;
      pbVar5 = pbVar5 + 1;
    }
    pbVar5[0] = 0x2e;
    pbVar5[1] = 0;
  }
  strcpy(local_238,(char *)local_138);
  if (local_248[0] != '\0') {
    sVar6 = strlen(local_238);
    (local_238 + sVar6)[0] = '.';
    (local_238 + sVar6)[1] = '~';
    local_238[sVar6 + 2] = '\0';
    strcat(local_238,local_248);
    sVar6 = strlen(local_238);
    (local_238 + sVar6)[0] = '~';
    (local_238 + sVar6)[1] = '\0';
  }
  pcVar7 = strchr(local_238,0x7e);
  pcVar4 = pcVar7;
  if (pcVar7 != (char *)0x0) {
    do {
      pcVar11 = pcVar4;
      lVar12 = 1;
      while( true ) {
        if (pcVar11[lVar12] == '\0') {
          if ((pcVar7 == pcVar11) || (lVar12 != 1 || pcVar7[-1] != '.')) goto LAB_001372b2;
          strncpy(local_258,pcVar7 + 1,(size_t)(pcVar11 + ~(ulong)pcVar7));
          local_258[(long)(pcVar11 + ~(ulong)pcVar7)] = '\0';
          if (local_258[0] == '\0') goto LAB_001372b2;
          goto joined_r0x0013725f;
        }
        if (pcVar11[lVar12] == '~') break;
        lVar12 = lVar12 + 1;
      }
      pcVar4 = pcVar11 + lVar12;
      pcVar7 = pcVar11;
    } while( true );
  }
LAB_001372b2:
  strcpy(file,local_238);
  return 1;
}

Assistant:

int quote_fname(char *file)
{
  char *cp, *dp;
  int extensionp;
  char fbuf[MAXNAMLEN + 1], namebuf[MAXNAMLEN + 1], ver[VERSIONLEN];

  cp = file;
  dp = fbuf;

  while (*cp) {
    switch (*cp) {
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }
  *dp = '\0';

  /*
   * extensionp indicates whether extension field is included in a file
   * name or not.  If extension field is not included, we have to add a
   * period to specify empty extension field.
   */
  separate_version(fbuf, ver, 1);
  cp = fbuf;
  extensionp = 0;
  while (*cp && !extensionp) {
    switch (*cp) {
      case '.':
        if (*(cp + 1)) extensionp = 1;
        cp++;
        break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  if (!extensionp) {
    if (*(cp - 1) == '.') {
      *(cp - 1) = '\'';
      *cp++ = '.';
    }
    *cp++ = '.';
    *cp = '\0';
  }
  if (*ver != '\0') {
    ConcNameAndVersion(fbuf, ver, namebuf);
  } else {
    strcpy(namebuf, fbuf);
  }
  UnixVersionToLispVersion(namebuf, 1);
  strcpy(file, namebuf);
  return (1);
}